

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SparseVector::SerializeWithCachedSizes
          (SparseVector *this,CodedOutputStream *output)

{
  uint uVar1;
  SparseNode *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SparseVector *this_local;
  
  local_20 = 0;
  uVar1 = nodes_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = nodes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void SparseVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SparseVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.SparseNode nodes = 1;
  for (unsigned int i = 0, n = this->nodes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->nodes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SparseVector)
}